

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator::
FastInstancesIterator<Kernel::TypedTermList>
          (FastInstancesIterator *this,
          SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *in_RCX;
  long in_RDI;
  InstMatcher *this_00;
  Node *root_00;
  Stack<void_*> *this_01;
  size_t initialCapacity;
  FastInstancesIterator *in_R8;
  Renaming *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  TypedTermList in_stack_ffffffffffffffb8;
  
  this_00 = (InstMatcher *)(in_RDI + 8);
  Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::VirtualIterator
            ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)this_00);
  root_00 = (Node *)(in_RDI + 0x10);
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::InstMatcher(this_00);
  Kernel::Renaming::Renaming(in_stack_ffffffffffffff70);
  this_01 = (Stack<void_*> *)(in_RDI + 0xb8);
  Lib::Stack<void_*>::Stack(this_01,in_stack_ffffffffffffff78);
  initialCapacity = in_RDI + 0xd8;
  Lib::Stack<unsigned_int>::Stack((Stack<unsigned_int> *)this_01,initialCapacity);
  Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>::
  Stack((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm> *)
        this_01,initialCapacity);
  InstanceCntr::InstanceCntr((InstanceCntr *)(in_RDI + 0x118));
  init<Kernel::TypedTermList>
            (in_R8,in_RCX,root_00,in_stack_ffffffffffffffb8,SUB81((ulong)in_RDI >> 0x38,0),
             SUB81((ulong)in_RDI >> 0x30,0));
  return;
}

Assistant:

FastInstancesIterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed)
      { init(parent,root,query,retrieveSubstitution,reversed); }